

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

AActor * P_SpawnMissileZAimed(AActor *source,double z,AActor *dest,PClassActor *type)

{
  DAngle type_00;
  uint uVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double local_68;
  TAngle<double> local_60;
  TFlags<ActorFlag,_unsigned_int> local_54;
  double local_50;
  double vz;
  double speed;
  double dist;
  DAngle an;
  PClassActor *type_local;
  AActor *dest_local;
  double z_local;
  AActor *source_local;
  
  if ((source == (AActor *)0x0) || (type == (PClassActor *)0x0)) {
    source_local = (AActor *)0x0;
  }
  else {
    an.Degrees = (double)type;
    TAngle<double>::TAngle((TAngle<double> *)&dist);
    TAngle<double>::operator=((TAngle<double> *)&dist,&(source->Angles).Yaw);
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_54,
               (int)dest +
               (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
    uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_54);
    if (uVar1 != 0) {
      iVar2 = FRandom::Random2(&pr_spawnmissile);
      TAngle<double>::operator+=((TAngle<double> *)&dist,(double)iVar2 * 0.044444444444444446);
    }
    speed = AActor::Distance2D(source,dest,false);
    local_68 = GetDefaultSpeed(an.Degrees);
    speed = speed / local_68;
    vz = local_68;
    if ((speed != 0.0) || (NAN(speed))) {
      dVar3 = AActor::Z(dest);
      dVar4 = AActor::Z(source);
      local_68 = (dVar3 - dVar4) / speed;
    }
    type_00.Degrees = an.Degrees;
    local_50 = local_68;
    TAngle<double>::TAngle(&local_60,(TAngle<double> *)&dist);
    source_local = P_SpawnMissileAngleZSpeed
                             (source,z,(PClassActor *)type_00.Degrees,&local_60,local_50,vz,
                              (AActor *)0x0,true);
  }
  return source_local;
}

Assistant:

AActor *P_SpawnMissileZAimed (AActor *source, double z, AActor *dest, PClassActor *type)
{
	if (source == nullptr || type == nullptr)
	{
		return nullptr;
	}
	DAngle an;
	double dist;
	double speed;
	double vz;

	an = source->Angles.Yaw;

	if (dest->flags & MF_SHADOW)
	{
		an += pr_spawnmissile.Random2() * (16. / 360.);
	}
	dist = source->Distance2D (dest);
	speed = GetDefaultSpeed (type);
	dist /= speed;
	vz = dist != 0 ? (dest->Z() - source->Z())/dist : speed;
	return P_SpawnMissileAngleZSpeed (source, z, type, an, vz, speed);
}